

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxconvenience.cpp
# Opt level: O0

void qglx_surfaceFormatFromGLXFBConfig
               (QSurfaceFormat *format,Display *display,GLXFBConfig config,int flags)

{
  uint in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QSurfaceFormat *in_RDI;
  long in_FS_OFFSET;
  int srgbCapable;
  int stereo;
  int sampleCount;
  int sampleBuffers;
  int stencilSize;
  int depthSize;
  int alphaSize;
  int blueSize;
  int greenSize;
  int redSize;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined1 enable;
  QSurfaceFormat *in_stack_ffffffffffffff90;
  undefined1 local_40 [16];
  int local_30 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30[9] = 0;
  local_30[8] = 0;
  local_30[7] = 0;
  local_30[6] = 0;
  local_30[5] = 0;
  local_30[4] = 0;
  local_30[3] = 0;
  local_30[2] = 0;
  local_30[1] = 0;
  local_30[0] = 0;
  glXGetFBConfigAttrib(in_RSI,in_RDX,8,local_30 + 9);
  glXGetFBConfigAttrib(in_RSI,in_RDX,9,local_30 + 8);
  glXGetFBConfigAttrib(in_RSI,in_RDX,10,local_30 + 7);
  glXGetFBConfigAttrib(in_RSI,in_RDX,0xb,local_30 + 6);
  glXGetFBConfigAttrib(in_RSI,in_RDX,0xc,local_30 + 5);
  glXGetFBConfigAttrib(in_RSI,in_RDX,0xd,local_30 + 4);
  glXGetFBConfigAttrib(in_RSI,in_RDX,100000,local_30 + 3);
  glXGetFBConfigAttrib(in_RSI,in_RDX,6,local_30 + 1);
  if ((in_ECX & 1) != 0) {
    glXGetFBConfigAttrib(in_RSI,in_RDX,0x20b2,local_30);
  }
  QSurfaceFormat::setRedBufferSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QSurfaceFormat::setGreenBufferSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QSurfaceFormat::setBlueBufferSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QSurfaceFormat::setAlphaBufferSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QSurfaceFormat::setDepthBufferSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QSurfaceFormat::setStencilBufferSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (local_30[3] != 0) {
    glXGetFBConfigAttrib(in_RSI,in_RDX,0x186a1,local_30 + 2);
    QSurfaceFormat::setSamples(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  if (local_30[0] == 0) {
    memset(local_40,0,8);
    QColorSpace::QColorSpace((QColorSpace *)0xa8ff48);
    QSurfaceFormat::setColorSpace
              (in_RDI,(QColorSpace *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    enable = (undefined1)((uint)in_stack_ffffffffffffff8c >> 0x18);
    QColorSpace::~QColorSpace((QColorSpace *)0xa8ff61);
  }
  else {
    QColorSpace::QColorSpace((QColorSpace *)in_RDI,(NamedColorSpace)((ulong)in_RSI >> 0x20));
    QSurfaceFormat::setColorSpace
              (in_stack_ffffffffffffff90,
               (QColorSpace *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    enable = (undefined1)((uint)in_stack_ffffffffffffff8c >> 0x18);
    QColorSpace::~QColorSpace((QColorSpace *)0xa8ff21);
    in_RDI = in_stack_ffffffffffffff90;
  }
  QSurfaceFormat::setStereo(in_RDI,(bool)enable);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qglx_surfaceFormatFromGLXFBConfig(QSurfaceFormat *format, Display *display, GLXFBConfig config, int flags)
{
    int redSize     = 0;
    int greenSize   = 0;
    int blueSize    = 0;
    int alphaSize   = 0;
    int depthSize   = 0;
    int stencilSize = 0;
    int sampleBuffers = 0;
    int sampleCount = 0;
    int stereo      = 0;
    int srgbCapable = 0;

    glXGetFBConfigAttrib(display, config, GLX_RED_SIZE,     &redSize);
    glXGetFBConfigAttrib(display, config, GLX_GREEN_SIZE,   &greenSize);
    glXGetFBConfigAttrib(display, config, GLX_BLUE_SIZE,    &blueSize);
    glXGetFBConfigAttrib(display, config, GLX_ALPHA_SIZE,   &alphaSize);
    glXGetFBConfigAttrib(display, config, GLX_DEPTH_SIZE,   &depthSize);
    glXGetFBConfigAttrib(display, config, GLX_STENCIL_SIZE, &stencilSize);
    glXGetFBConfigAttrib(display, config, GLX_SAMPLE_BUFFERS_ARB, &sampleBuffers);
    glXGetFBConfigAttrib(display, config, GLX_STEREO,       &stereo);
    if (flags & QGLX_SUPPORTS_SRGB)
        glXGetFBConfigAttrib(display, config, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &srgbCapable);

    format->setRedBufferSize(redSize);
    format->setGreenBufferSize(greenSize);
    format->setBlueBufferSize(blueSize);
    format->setAlphaBufferSize(alphaSize);
    format->setDepthBufferSize(depthSize);
    format->setStencilBufferSize(stencilSize);
    if (sampleBuffers) {
        glXGetFBConfigAttrib(display, config, GLX_SAMPLES_ARB, &sampleCount);
        format->setSamples(sampleCount);
    }
    if (srgbCapable)
        format->setColorSpace(QColorSpace::SRgb);
    else
        format->setColorSpace(QColorSpace());

    format->setStereo(stereo);
}